

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData_const&>
          (QMovableArrayOps<QWidgetItemData> *this,qsizetype i,QWidgetItemData *args)

{
  QWidgetItemData **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  QWidgetItemData *pQVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_80;
  QWidgetItemData tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
           d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
        size == i) {
      qVar6 = QArrayDataPointer<QWidgetItemData>::freeSpaceAtEnd
                        ((QArrayDataPointer<QWidgetItemData> *)this);
      if (qVar6 == 0) goto LAB_0052673f;
      QWidgetItemData::QWidgetItemData
                ((this->super_QGenericArrayOps<QWidgetItemData>).
                 super_QArrayDataPointer<QWidgetItemData>.ptr +
                 (this->super_QGenericArrayOps<QWidgetItemData>).
                 super_QArrayDataPointer<QWidgetItemData>.size,args);
LAB_0052687c:
      pqVar2 = &(this->super_QGenericArrayOps<QWidgetItemData>).
                super_QArrayDataPointer<QWidgetItemData>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0052683b;
    }
LAB_0052673f:
    if (i == 0) {
      qVar6 = QArrayDataPointer<QWidgetItemData>::freeSpaceAtBegin
                        ((QArrayDataPointer<QWidgetItemData> *)this);
      if (qVar6 != 0) {
        QWidgetItemData::QWidgetItemData
                  ((this->super_QGenericArrayOps<QWidgetItemData>).
                   super_QArrayDataPointer<QWidgetItemData>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QWidgetItemData>).
                   super_QArrayDataPointer<QWidgetItemData>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0052687c;
      }
    }
  }
  tmp.value.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  QWidgetItemData::QWidgetItemData(&tmp,args);
  bVar7 = (this->super_QGenericArrayOps<QWidgetItemData>).super_QArrayDataPointer<QWidgetItemData>.
          size != 0;
  QArrayDataPointer<QWidgetItemData>::detachAndGrow
            ((QArrayDataPointer<QWidgetItemData> *)this,(uint)(i == 0 && bVar7),1,
             (QWidgetItemData **)0x0,(QArrayDataPointer<QWidgetItemData> *)0x0);
  if (i == 0 && bVar7) {
    pQVar5 = (this->super_QGenericArrayOps<QWidgetItemData>).
             super_QArrayDataPointer<QWidgetItemData>.ptr;
    pQVar5[-1].role = tmp.role;
    *(undefined8 *)((long)&pQVar5[-1].value.d.data + 0x10) = tmp.value.d.data._16_8_;
    *(undefined8 *)&pQVar5[-1].value.d.field_0x18 = tmp.value.d._24_8_;
    pQVar5[-1].value.d.data.shared = tmp.value.d.data.shared;
    *(undefined8 *)((long)&pQVar5[-1].value.d.data + 8) = tmp.value.d.data._8_8_;
    tmp.value.d.data.shared = (PrivateShared *)0x0;
    tmp.value.d.data._8_8_ = 0;
    tmp.value.d.data._16_8_ = 0;
    tmp.value.d._24_8_ = 2;
    ppQVar1 = &(this->super_QGenericArrayOps<QWidgetItemData>).
               super_QArrayDataPointer<QWidgetItemData>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QWidgetItemData>).
              super_QArrayDataPointer<QWidgetItemData>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QWidgetItemData> *)this,i,1);
    (local_80.displaceFrom)->role = tmp.role;
    *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 0x10) = tmp.value.d.data._16_8_
    ;
    *(undefined8 *)&((local_80.displaceFrom)->value).d.field_0x18 = tmp.value.d._24_8_;
    ((local_80.displaceFrom)->value).d.data.shared = tmp.value.d.data.shared;
    *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 8) = tmp.value.d.data._8_8_;
    tmp.value.d.data.shared = (PrivateShared *)0x0;
    tmp.value.d.data._8_8_ = 0;
    tmp.value.d.data._16_8_ = 0;
    tmp.value.d._24_8_ = 2;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    Inserter::~Inserter(&local_80);
  }
  ::QVariant::~QVariant(&tmp.value);
LAB_0052683b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }